

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

double __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
           *this,int variable,bit_array *x)

{
  int *piVar1;
  int iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM4_Qb;
  undefined1 local_28 [16];
  
  sparse_matrix<int>::column((sparse_matrix<int> *)local_28,(int)this + 0x10);
  if (local_28._8_8_ == local_28._0_8_) {
    dVar3 = 0.0;
  }
  else {
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar4 = ZEXT816(0);
    do {
      iVar2 = *(int *)local_28._8_8_;
      piVar1 = (int *)(local_28._8_8_ + 4);
      local_28._8_8_ = local_28._8_8_ + 8;
      auVar6._0_8_ = (double)(this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl[iVar2];
      auVar6._8_8_ = in_XMM4_Qb;
      auVar6 = vandpd_avx(auVar6,auVar5);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[*piVar1] +
                     (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar2];
      auVar4 = vfmadd231sd_fma(auVar4,auVar6,auVar7);
      dVar3 = auVar4._0_8_;
    } while (local_28._8_8_ != local_28._0_8_);
  }
  return (this->c->linear_elements)._M_t.
         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl[variable] - dVar3;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }